

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::gather_big<unsigned_long>
               (unsigned_long *data,size_t size,unsigned_long *out,int root,comm *comm)

{
  MPI_Datatype poVar1;
  MPI_Datatype poVar2;
  MPI_Comm poVar3;
  datatype local_60;
  undefined1 local_48 [8];
  datatype dt;
  comm *comm_local;
  int root_local;
  unsigned_long *out_local;
  size_t size_local;
  unsigned_long *data_local;
  
  dt._16_8_ = comm;
  get_datatype<unsigned_long>();
  mxx::datatype::contiguous((datatype *)local_48,&local_60,size);
  mxx::datatype::~datatype(&local_60);
  poVar1 = mxx::datatype::type((datatype *)local_48);
  poVar2 = mxx::datatype::type((datatype *)local_48);
  poVar3 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
  MPI_Gather(data,1,poVar1,out,1,poVar2,root,poVar3);
  mxx::datatype::~datatype((datatype *)local_48);
  return;
}

Assistant:

void gather_big(const T* data, size_t size, T* out, int root, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Gather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), root, comm);
}